

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Stress::FenceSyncCase::iterate(FenceSyncCase *this)

{
  undefined1 *value;
  Random *rnd;
  vector<__GLsync_*,_std::allocator<__GLsync_*>_> *this_00;
  ostringstream *poVar1;
  uint uVar2;
  TestLog *log;
  const_iterator __first;
  const_iterator __last;
  bool bVar3;
  GLenum GVar4;
  GLenum err;
  MessageBuilder *pMVar5;
  GLsync p_Var6;
  TestError *pTVar7;
  IterateResult IVar8;
  ulong uVar9;
  int i;
  long lVar10;
  char *pcVar11;
  int i_1;
  int iVar12;
  GLint first;
  ulong uVar13;
  float fVar14;
  vector<float,_std::allocator<float>_> vertices;
  int local_234;
  ScopedLogSection section;
  string local_210;
  string local_1f0;
  string header;
  undefined1 local_1b0 [384];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_234 = this->m_iterNdx + 1;
  de::toString<int>(&local_1f0,&local_234);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                 "Case iteration ",&local_1f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section," / "
                );
  de::toString<int>(&local_210,&NUM_CASE_ITERATIONS);
  std::operator+(&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_1f0);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,&header,&header);
  (this->super_CallLogWrapper).m_enableLog = true;
  if (this->m_program == (ShaderProgram *)0x0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"m_program",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
               ,0xaa);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnable(0xb71);
  glwClearColor(0.3,0.3,0.3,1.0);
  glwClearDepthf(1.0);
  glwClear(0x4100);
  glwEnableVertexAttribArray(0);
  iVar12 = *(int *)&(this->super_CallLogWrapper).field_0x14;
  std::vector<float,_std::allocator<float>_>::resize(&vertices,(long)(iVar12 * 0xc));
  value = &(this->super_CallLogWrapper).field_0x14;
  uVar2 = iVar12 * 3;
  uVar13 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar13;
  }
  rnd = &this->m_rnd;
  for (; uVar9 * 4 != uVar13; uVar13 = uVar13 + 4) {
    fVar14 = deRandom_getFloat(&rnd->m_rnd);
    iVar12 = (int)uVar13;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12] = fVar14 + fVar14 + -1.0;
    fVar14 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 1] = fVar14 + fVar14 + -1.0;
    fVar14 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 2] = fVar14 + 0.0;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar12 + 3] = 1.0;
  }
  glwVertexAttribPointer
            (0,4,0x1406,'\0',0,
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  this_00 = &this->m_syncObjects;
  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::resize
            (this_00,(long)*(int *)&(this->super_CallLogWrapper).field_0x14);
  (this->super_CallLogWrapper).m_enableLog = false;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// NOT LOGGED: ");
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " glDrawArrays and glFenceSync calls done here.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  first = 0;
  for (lVar10 = 0; lVar10 < *(int *)value; lVar10 = lVar10 + 1) {
    glwDrawArrays(4,first,3);
    p_Var6 = glwFenceSync(0x9117,0);
    (this_00->super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar10] = p_Var6;
    GVar4 = glwGetError();
    glu::checkError(GVar4,"Sync object created",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                    ,0xc1);
    first = first + 3;
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// Draws performed, sync objects created.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<__GLsync**,std::vector<__GLsync*,std::allocator<__GLsync*>>>>
            (rnd,(__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>
                  )(this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>)
             (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  (this->super_CallLogWrapper).m_enableLog = false;
  if ((this->m_waitCommand & 1) == 0) {
    if ((this->m_waitCommand & 2) == 0) goto LAB_011b9eea;
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"// NOT LOGGED: ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " glClientWaitSync calls done here.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"// NOT LOGGED: ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " glWaitSync calls done here.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
LAB_011b9eea:
  bVar3 = true;
  lVar10 = 0;
  do {
    if (*(int *)value <= lVar10) {
      (this->super_CallLogWrapper).m_enableLog = true;
      glwFinish();
      (this->super_CallLogWrapper).m_enableLog = false;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// NOT LOGGED: ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " glDeleteSync calls done here.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      lVar10 = 0;
      while( true ) {
        __first._M_current =
             (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if ((int)((ulong)((long)__last._M_current - (long)__first._M_current) >> 3) <= lVar10)
        break;
        if (__first._M_current[lVar10] != (GLsync)0x0) {
          glwDeleteSync(__first._M_current[lVar10]);
          GVar4 = glwGetError();
          glu::checkError(GVar4,"Sync object deleted",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                          ,0xf5);
        }
        lVar10 = lVar10 + 1;
      }
      (this->super_CallLogWrapper).m_enableLog = true;
      std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::erase(this_00,__first,__last);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// Test result: ");
      pcVar11 = "Failed!";
      if (bVar3) {
        pcVar11 = "Passed!";
      }
      std::operator<<((ostream *)poVar1,pcVar11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      if (bVar3) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"// Sync objects created and deleted successfully.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar2 = this->m_iterNdx;
        this->m_iterNdx = uVar2 + 1;
        IVar8 = (IterateResult)(0x7ffffffe < uVar2);
      }
      else {
        IVar8 = STOP;
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      std::__cxx11::string::~string((string *)&header);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&vertices.super__Vector_base<float,_std::allocator<float>_>);
      return IVar8;
    }
    if ((this->m_waitCommand & 1) == 0) {
      if ((this->m_waitCommand & 2) != 0) {
        GVar4 = glwClientWaitSync((this_00->
                                  super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start[lVar10],0,100);
        err = glwGetError();
        glu::checkError(err,"glClientWaitSync called",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                        ,0xdc);
        if (2 < GVar4 - 0x911a) {
          if (GVar4 != 0x911d) {
            pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar7,"glClientWaitSync returned an unknown return value.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                       ,0xe3);
            __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          poVar1 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"// glClientWaitSync returned GL_WAIT_FAILED");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar3 = false;
        }
      }
    }
    else {
      glwWaitSync((this_00->super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar10],0,0xffffffffffffffff);
      GVar4 = glwGetError();
      glu::checkError(GVar4,"glWaitSync called",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                      ,0xd7);
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&				log		= m_testCtx.getLog();
	std::vector<float>		vertices;
	bool					testOk	= true;

	std::string				header	= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	tcu::ScopedLogSection	section	(log, header, header);

	enableLogging(true);

	TCU_CHECK		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray	(0);
	generateVertices			(vertices, m_numSyncs, m_rnd);
	glVertexAttribPointer		(0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);
	m_syncObjects.resize		(m_numSyncs);

	// Perform draws and create sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDrawArrays and glFenceSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		glDrawArrays(GL_TRIANGLES, i*3, 3);
		m_syncObjects[i] = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_CHECK_MSG("Sync object created");
	}
	enableLogging(true);
	log << TestLog::Message << "// Draws performed, sync objects created." << TestLog::EndMessage;

	// Wait for sync objects

	m_rnd.shuffle(m_syncObjects.begin(), m_syncObjects.end());

	enableLogging(false);
	if (m_waitCommand & COMMAND_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glWaitSync calls done here." << TestLog::EndMessage;
	else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glClientWaitSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		GLenum waitValue = 0;

		if (m_waitCommand & COMMAND_WAIT_SYNC)
		{
			glWaitSync(m_syncObjects[i], 0, GL_TIMEOUT_IGNORED);
			GLU_CHECK_MSG("glWaitSync called");
		}
		else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		{
			waitValue = glClientWaitSync(m_syncObjects[i], 0, 100);
			GLU_CHECK_MSG("glClientWaitSync called");
			switch (waitValue)
			{
				case GL_ALREADY_SIGNALED:	 break;
				case GL_TIMEOUT_EXPIRED:	 break;
				case GL_CONDITION_SATISFIED: break;
				case GL_WAIT_FAILED:		 log << TestLog::Message << "// glClientWaitSync returned GL_WAIT_FAILED"	<< TestLog::EndMessage; testOk = false; break;
				default:					 TCU_FAIL("glClientWaitSync returned an unknown return value.");
			}
		}
	}
	enableLogging(true);

	glFinish();

	// Delete sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDeleteSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
	{
		if (m_syncObjects[i])
		{
			glDeleteSync(m_syncObjects[i]);
			GLU_CHECK_MSG("Sync object deleted");
		}
	}

	enableLogging(true);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}